

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void update_members_offset(type *type,mir_size_t offset)

{
  void *pvVar1;
  mir_size_t mVar2;
  mir_size_t offset_00;
  node_t pnVar3;
  
  if (((type->mode & ~TM_BASIC) != TM_STRUCT) ||
     (type->unnamed_anon_struct_union_member_type_p == '\0')) {
    __assert_fail("(type->mode == TM_STRUCT || type->mode == TM_UNION) && type->unnamed_anon_struct_union_member_type_p"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x181c,"void update_members_offset(struct type *, mir_size_t)");
  }
  if ((offset == 0xffffffffffffffff) && (type->raw_size != 0xffffffffffffffff)) {
    __assert_fail("offset != MIR_SIZE_MAX || type->raw_size == MIR_SIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x181d,"void update_members_offset(struct type *, mir_size_t)");
  }
  for (pnVar3 = (((((((type->u).tag_type)->u).ops.head)->op_link).next)->u).ops.head;
      pnVar3 != (node_t)0x0; pnVar3 = (pnVar3->op_link).next) {
    if (pnVar3->code == N_MEMBER) {
      pvVar1 = pnVar3->attr;
      if (offset == 0xffffffffffffffff) {
        offset_00 = 0xffffffffffffffff;
        mVar2 = 0;
      }
      else {
        mVar2 = *(long *)((long)pvVar1 + 0x10) + offset;
        offset_00 = mVar2;
      }
      *(mir_size_t *)((long)pvVar1 + 0x10) = mVar2;
      if ((*(type **)((long)pvVar1 + 0x40))->unnamed_anon_struct_union_member_type_p != '\0') {
        update_members_offset(*(type **)((long)pvVar1 + 0x40),offset_00);
      }
    }
  }
  return;
}

Assistant:

static void update_members_offset (struct type *type, mir_size_t offset) {
  assert ((type->mode == TM_STRUCT || type->mode == TM_UNION)
          && type->unnamed_anon_struct_union_member_type_p);
  assert (offset != MIR_SIZE_MAX || type->raw_size == MIR_SIZE_MAX);
  for (node_t el = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); el != NULL;
       el = NL_NEXT (el))
    if (el->code == N_MEMBER) {
      decl_t decl = el->attr;

      decl->offset = offset == MIR_SIZE_MAX ? 0 : decl->offset + offset;
      if (decl->decl_spec.type->unnamed_anon_struct_union_member_type_p)
        update_members_offset (decl->decl_spec.type,
                               offset == MIR_SIZE_MAX ? offset : decl->offset);
    }
}